

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Expr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   *this)

{
  StringRef value;
  Expr else_expr_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Expr condition_00;
  ExprBase in_RDI;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  char c;
  int in_stack_00000164;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_00000168;
  type_conflict in_stack_ffffffffffffff74;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffff78;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this_00;
  undefined4 in_stack_ffffffffffffff88;
  ExprBase in_stack_ffffffffffffff90;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffd8 [16];
  undefined2 uVar5;
  undefined7 in_stack_ffffffffffffffe8;
  TextReader<fmt::Locale> *this_01;
  ExprBase local_8;
  
  uVar5 = in_stack_ffffffffffffffd8._14_2_;
  this_01 = (TextReader<fmt::Locale> *)in_RDI.impl_;
  cVar1 = ReaderBase::ReadChar
                    ((ReaderBase *)
                     (((TextReader<fmt::Locale> *)in_RDI.impl_)->super_ReaderBase).ptr_);
  iVar2 = (int)cVar1;
  if (iVar2 == 0x68) {
    this_00 = *(NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> **)
               (in_RDI.impl_ + 4);
    TextReader<fmt::Locale>::ReadString(this_01);
    value.size_._0_4_ = in_stack_ffffffffffffff88;
    value.data_ = (char *)in_RDI.impl_;
    value.size_._4_4_ = iVar2;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnString
                           (this_00,value);
  }
  else if (iVar2 == 0x6f) {
    iVar3 = ReadOpCode((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)in_RDI.impl_);
    iVar4 = mp::expr::nl_opcode(IFSYM);
    if (iVar3 == iVar4) {
      ReadLogicalExpr(in_stack_ffffffffffffff98);
      ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      condition_00 = ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                       *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      else_expr_00.super_ExprBase.impl_._4_4_ = iVar2;
      else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_ffffffffffffff88;
      local_8.impl_ =
           (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnSymbolicIf
                             ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                              in_RDI.impl_,(LogicalExpr)condition_00.super_ExprBase.impl_,
                              (Expr)in_stack_ffffffffffffff90.impl_,else_expr_00);
    }
    else {
      ReadNumericExpr(in_stack_00000168,in_stack_00000164);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_ffffffffffffff78,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RDI.impl_,iVar3);
    }
  }
  else {
    ReadNumericExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)CONCAT17(cVar1,in_stack_ffffffffffffffe8),(char)((ushort)uVar5 >> 8),
                    SUB21(uVar5,0));
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              (in_stack_ffffffffffffff78,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RDI.impl_,
               in_stack_ffffffffffffff74);
  }
  return (Expr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}